

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O2

void __thiscall AutoFile::~AutoFile(AutoFile *this)

{
  long lVar1;
  FILE *in_RSI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fclose(this,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
              (&(this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~AutoFile() { fclose(); }